

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void reduce_one(Parser *p,Reduction *r)

{
  SNode *ps;
  VecZNode *path_00;
  ZNode *pZVar1;
  int iVar2;
  uint32 uVar3;
  PNode *pPVar4;
  VecZNode *path;
  VecVecZNode paths;
  uint local_40;
  uint n;
  uint j;
  uint i;
  ZNode *first_z;
  PNode *last_pn;
  PNode *pn;
  SNode *sn;
  Reduction *r_local;
  Parser *p_local;
  
  ps = r->snode;
  paths.e[2]._4_4_ = (uint)r->reduction->nelements;
  if (r->znode == (ZNode *)0x0) {
    pPVar4 = add_PNode(p,(uint)r->reduction->symbol,&ps->loc,(ps->loc).s,ps->last_pn,r->reduction,
                       (VecZNode *)0x0,(D_Shift *)0x0);
    if (pPVar4 != (PNode *)0x0) {
      goto_PNode(p,&ps->loc,pPVar4,ps);
    }
  }
  else {
    path._0_4_ = 0;
    paths.n = 0;
    paths.i = 0;
    build_paths(r->znode,(VecVecZNode *)&path,paths.e[2]._4_4_);
    for (n = 0; n < (uint)path; n = n + 1) {
      path_00 = *(VecZNode **)(paths._0_8_ + (ulong)n * 8);
      if (r->new_snode == (SNode *)0x0) {
LAB_001536dd:
        if ((path_00->n < 2) ||
           ((((*path_00->v)->pn->op_assoc == ASSOC_NONE &&
             (path_00->v[1]->pn->op_assoc == ASSOC_NONE)) ||
            (iVar2 = check_path_priorities_internal(path_00), iVar2 == 0)))) {
          p->reductions = p->reductions + 1;
          pZVar1 = path_00->v[paths.e[2]._4_4_ - 1];
          pPVar4 = add_PNode(p,(uint)r->reduction->symbol,&(pZVar1->pn->parse_node).start_loc,
                             (ps->loc).s,(*path_00->v)->pn,r->reduction,path_00,(D_Shift *)0x0);
          if (pPVar4 != (PNode *)0x0) {
            for (local_40 = 0; local_40 < (pZVar1->sns).n; local_40 = local_40 + 1) {
              goto_PNode(p,&ps->loc,pPVar4,(pZVar1->sns).v[local_40]);
            }
          }
        }
      }
      else {
        for (local_40 = 0;
            (local_40 < (path_00->v[r->new_depth]->sns).n &&
            ((path_00->v[r->new_depth]->sns).v[local_40] != r->new_snode)); local_40 = local_40 + 1)
        {
        }
        if (local_40 < (path_00->v[r->new_depth]->sns).n) goto LAB_001536dd;
      }
    }
    free_paths((VecVecZNode *)&path);
  }
  uVar3 = ps->refcount - 1;
  ps->refcount = uVar3;
  if (uVar3 == 0) {
    free_SNode(p,ps);
  }
  r->next = p->free_reductions;
  p->free_reductions = r;
  return;
}

Assistant:

static void reduce_one(Parser *p, Reduction *r) {
  SNode *sn = r->snode;
  PNode *pn, *last_pn;
  ZNode *first_z;
  uint i, j, n = r->reduction->nelements;
  VecVecZNode paths;
  VecZNode *path;

  if (!r->znode) { /* epsilon reduction */
    if ((pn = add_PNode(p, r->reduction->symbol, &sn->loc, sn->loc.s, sn->last_pn, r->reduction, 0, 0)))
      goto_PNode(p, &sn->loc, pn, sn);
  } else {
    DBG(printf("reduce %d %p %d\n", (int)(r->snode->state - p->t->state), (void *)sn, n));
    vec_clear(&paths);
    build_paths(r->znode, &paths, n);
    for (i = 0; i < paths.n; i++) {
      path = paths.v[i];
      if (r->new_snode) { /* prune paths by new right epsilon node */
        for (j = 0; j < path->v[r->new_depth]->sns.n; j++)
          if (path->v[r->new_depth]->sns.v[j] == r->new_snode) break;
        if (j >= path->v[r->new_depth]->sns.n) continue;
      }
      if (check_path_priorities(path)) continue;
      p->reductions++;
      last_pn = path->v[0]->pn;
      first_z = path->v[n - 1];
      pn = add_PNode(p, r->reduction->symbol, &first_z->pn->parse_node.start_loc, sn->loc.s, last_pn, r->reduction,
                     path, NULL);
      if (pn)
        for (j = 0; j < first_z->sns.n; j++) goto_PNode(p, &sn->loc, pn, first_z->sns.v[j]);
    }
    free_paths(&paths);
  }
  unref_sn(p, sn);
  r->next = p->free_reductions;
  p->free_reductions = r;
}